

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> * __thiscall
capnp::compiler::Compiler::Node::resolveImport
          (Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *__return_storage_ptr__,
          Node *this,StringPtr name)

{
  Which WVar1;
  Module *pMVar2;
  uint64_t uVar3;
  int iVar4;
  undefined4 extraout_var;
  CompiledModule *pCVar5;
  Maybe<capnp::schema::Brand::Reader> *pMVar6;
  
  pCVar5 = this->module;
  pMVar2 = pCVar5->parserModule;
  iVar4 = (*(pMVar2->super_ErrorReporter)._vptr_ErrorReporter[4])
                    (pMVar2,name.content.ptr,name.content.size_);
  if ((Module *)CONCAT44(extraout_var,iVar4) == (Module *)0x0) {
    pCVar5 = (CompiledModule *)0x0;
  }
  else {
    pCVar5 = Compiler::Impl::addInternal(pCVar5->compiler,(Module *)CONCAT44(extraout_var,iVar4));
  }
  pMVar6 = (Maybe<capnp::schema::Brand::Reader> *)__return_storage_ptr__;
  if (pCVar5 != (CompiledModule *)0x0) {
    uVar3 = (pCVar5->rootNode).id;
    WVar1 = (pCVar5->rootNode).kind;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.id = uVar3;
    (__return_storage_ptr__->ptr).field_1.value.genericParamCount = 0;
    (__return_storage_ptr__->ptr).field_1.value.scopeId = 0;
    (__return_storage_ptr__->ptr).field_1.value.kind = WVar1;
    (__return_storage_ptr__->ptr).field_1.value.resolver = &(pCVar5->rootNode).super_Resolver;
    pMVar6 = &(__return_storage_ptr__->ptr).field_1.value.brand;
  }
  ((NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *)&pMVar6->ptr)->isSet =
       false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::Resolver::ResolvedDecl>
Compiler::Node::resolveImport(kj::StringPtr name) {
  KJ_IF_MAYBE(m, module->importRelative(name)) {
    Node& root = m->getRootNode();
    return ResolvedDecl { root.id, 0, 0, root.kind, &root, nullptr };
  } else {
    return nullptr;
  }
}